

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O3

void __thiscall t_json_generator::write_type_spec(t_json_generator *this,t_type *ttype)

{
  t_type *ttype_00;
  int iVar1;
  t_type *ptVar2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  char *pcVar6;
  _Alloc_hider _Var7;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ptVar2 = t_type::get_true_type(ttype);
  get_type_name_abi_cxx11_(&local_50,(t_json_generator *)ttype,ptVar2);
  write_string(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"annotations","");
    write_key_and(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    start_object(this,true);
    p_Var3 = (ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(ptVar2->annotations_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var5) {
      do {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,*(long *)(p_Var3 + 2),
                   (long)&(p_Var3[2]._M_parent)->_M_color + *(long *)(p_Var3 + 2));
        write_key_and_string(this,&local_1f0,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    }
    end_object(this);
  }
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0')) {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
        if ((char)iVar1 == '\0') {
          return;
        }
        ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
        paVar4 = &local_1d0.field_2;
        pcVar6 = "elemTypeId";
        local_1d0._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"elemTypeId","");
        get_type_name_abi_cxx11_(&local_110,(t_json_generator *)pcVar6,ptVar2);
        write_key_and_string(this,&local_1d0,&local_110);
        _Var7._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
          _Var7._M_p = local_1d0._M_dataplus._M_p;
        }
      }
      else {
        ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
        paVar4 = &local_1b0.field_2;
        pcVar6 = "elemTypeId";
        local_1b0._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"elemTypeId","");
        get_type_name_abi_cxx11_(&local_f0,(t_json_generator *)pcVar6,ptVar2);
        write_key_and_string(this,&local_1b0,&local_f0);
        _Var7._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
          _Var7._M_p = local_1b0._M_dataplus._M_p;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != paVar4) {
        operator_delete(_Var7._M_p);
      }
      pcVar6 = "elemType";
    }
    else {
      ttype_00 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
      ptVar2 = *(t_type **)&ptVar2[1].annotations_._M_t._M_impl;
      pcVar6 = "keyTypeId";
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"keyTypeId","");
      get_type_name_abi_cxx11_(&local_b0,(t_json_generator *)pcVar6,ttype_00);
      write_key_and_string(this,&local_170,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      pcVar6 = "valueTypeId";
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"valueTypeId","");
      get_type_name_abi_cxx11_(&local_d0,(t_json_generator *)pcVar6,ptVar2);
      write_key_and_string(this,&local_190,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      write_type_spec_object(this,"keyType",ttype_00);
      pcVar6 = "valueType";
    }
    write_type_spec_object(this,pcVar6,ptVar2);
  }
  else {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"class","");
    get_qualified_name_abi_cxx11_(&local_90,this,ptVar2);
    write_key_and_string(this,&local_150,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void t_json_generator::write_type_spec(t_type* ttype) {
  ttype = ttype->get_true_type();

  write_string(get_type_name(ttype));

  if (ttype->annotations_.size() > 0) {
    write_key_and("annotations");
    start_object();
    for (auto & annotation : ttype->annotations_) {
      write_key_and_string(annotation.first, annotation.second);
    }
    end_object();
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    write_key_and_string("class", get_qualified_name(ttype));
  } else if (ttype->is_map()) {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_key_and_string("keyTypeId", get_type_name(ktype));
    write_key_and_string("valueTypeId", get_type_name(vtype));
    write_type_spec_object("keyType", ktype);
    write_type_spec_object("valueType", vtype);
  } else if (ttype->is_list()) {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  } else if (ttype->is_set()) {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_key_and_string("elemTypeId", get_type_name(etype));
    write_type_spec_object("elemType", etype);
  }
}